

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int ffcrow(fitsfile *fptr,int datatype,char *expr,long firstrow,long nelements,void *nulval,
          void *array,int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong local_1e0;
  int naxis;
  parseInfo Info;
  ParseData lParse;
  long naxes [5];
  
  iVar1 = *status;
  if (iVar1 == 0) {
    memset(&Info,0,0x90);
    iVar1 = ffiprs(fptr,0,expr,5,&Info.datatype,(long *)&local_1e0,&naxis,naxes,&lParse,status);
    if (iVar1 == 0) {
      uVar3 = -local_1e0;
      if (0 < (long)local_1e0) {
        uVar3 = local_1e0;
      }
      if (nelements < (long)uVar3) {
        ffcprs(&lParse);
        ffpmsg("Array not large enough to hold at least one row of data.");
        *status = 0x1b1;
        iVar1 = 0x1b1;
      }
      else {
        lVar2 = 1;
        if (1 < firstrow) {
          lVar2 = firstrow;
        }
        if (datatype != 0) {
          Info.datatype = datatype;
        }
        Info.dataPtr = array;
        Info.maxRows = (ulong)nelements / uVar3;
        Info.nullPtr = nulval;
        Info.parseData = &lParse;
        iVar1 = ffiter(lParse.nCols,lParse.colData,lVar2 + -1,0,fits_parser_workfn,&Info,status);
        if (iVar1 == -1) {
          *status = 0;
        }
        *anynul = Info.anyNull;
        ffcprs(&lParse);
        iVar1 = *status;
      }
    }
    else {
      ffcprs(&lParse);
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int ffcrow( fitsfile *fptr,      /* I - Input FITS file                      */
            int      datatype,   /* I - Datatype to return results as        */
            char     *expr,      /* I - Arithmetic expression                */
            long     firstrow,   /* I - First row to evaluate                */
            long     nelements,  /* I - Number of elements to return         */
            void     *nulval,    /* I - Ptr to value to use as UNDEF         */
            void     *array,     /* O - Array of results                     */
            int      *anynul,    /* O - Were any UNDEFs encountered?         */
            int      *status )   /* O - Error status                         */
/*                                                                           */
/* Calculate an expression for the indicated rows of a table, returning      */
/* the results, cast as datatype (TSHORT, TDOUBLE, etc), in array.  If       */
/* nulval==NULL, UNDEFs will be zeroed out.  For vector results, the number  */
/* of elements returned may be less than nelements if nelements is not an    */
/* even multiple of the result dimension.  Call fftexp to obtain the         */
/* dimensions of the results.                                                */
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis;
   long nelem1, naxes[MAXDIMS];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem1, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }
   if( nelem1<0 ) nelem1 = - nelem1;

   if( nelements<nelem1 ) {
      ffcprs(&lParse);
      ffpmsg("Array not large enough to hold at least one row of data.");
      return( *status = PARSE_LRG_VECTOR );
   }

   firstrow = (firstrow>1 ? firstrow : 1);

   if( datatype ) Info.datatype = datatype;

   Info.dataPtr = array;
   Info.nullPtr = nulval;
   Info.maxRows = nelements / nelem1;
   Info.parseData = &lParse;
   
   if( ffiter( lParse.nCols, lParse.colData, firstrow-1, 0,
               fits_parser_workfn, (void*)&Info, status ) == -1 )
      *status=0;  /* -1 indicates exitted without error before end... OK */

   *anynul = Info.anyNull;
   ffcprs(&lParse);
   return( *status );
}